

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

bool __thiscall soplex::SPxBasisBase<double>::isDescValid(SPxBasisBase<double> *this,Desc *ds)

{
  double dVar1;
  Status SVar2;
  int iVar3;
  int iVar4;
  Status SVar5;
  Status *pSVar6;
  double *pdVar7;
  double *pdVar8;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *in_RSI;
  SPxBasisBase<double> *in_RDI;
  int col;
  int row;
  int basisdim;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  double in_stack_ffffffffffffff80;
  SPxBasisBase<double> *in_stack_ffffffffffffff88;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *local_18;
  
  local_18 = in_RSI;
  iVar3 = Desc::nRows((Desc *)0x25ea71);
  iVar4 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x25ea85);
  if (iVar3 == iVar4) {
    iVar3 = Desc::nCols((Desc *)0x25ea9c);
    iVar4 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x25eab0);
    if (iVar3 == iVar4) {
      local_1c = 0;
      local_20 = Desc::nRows((Desc *)0x25eaf0);
      do {
        do {
          while( true ) {
            local_20 = local_20 + -1;
            if (local_20 < 0) {
              local_24 = Desc::nCols((Desc *)0x25ed5d);
              goto LAB_0025ed67;
            }
            pSVar6 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                               (local_18,local_20);
            if (*pSVar6 < ~P_FREE) break;
            pSVar6 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                               (local_18,local_20);
            SVar2 = *pSVar6;
            SVar5 = dualRowStatus(in_stack_ffffffffffffff88,
                                  (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
            if (SVar2 != SVar5) {
              pSVar6 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                                 (local_18,local_20);
              SPxOut::
              debug<soplex::SPxBasisBase<double>,_const_char_(&)[53],_int_&,_const_soplex::SPxBasisBase<double>::Desc::Status_&,_0>
                        (in_RDI,(char (*) [53])
                                "IBASIS21 Basic row {} with incorrect dual status {}\n",&local_20,
                         pSVar6);
              return false;
            }
          }
          local_1c = local_1c + 1;
          pSVar6 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                             (local_18,local_20);
          if (*pSVar6 == P_FIXED) {
            pdVar7 = SPxLPBase<double>::lhs
                               ((SPxLPBase<double> *)
                                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                in_stack_ffffffffffffff5c);
            dVar1 = *pdVar7;
            pdVar7 = SPxLPBase<double>::rhs
                               ((SPxLPBase<double> *)
                                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                in_stack_ffffffffffffff5c);
            if ((dVar1 != *pdVar7) || (NAN(dVar1) || NAN(*pdVar7))) goto LAB_0025ecc0;
          }
          pSVar6 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                             (local_18,local_20);
          if (*pSVar6 == P_ON_UPPER) {
            pdVar7 = SPxLPBase<double>::rhs
                               ((SPxLPBase<double> *)
                                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                in_stack_ffffffffffffff5c);
            dVar1 = *pdVar7;
            pdVar7 = (double *)infinity();
            if (*pdVar7 <= dVar1) goto LAB_0025ecc0;
          }
          pSVar6 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                             (local_18,local_20);
        } while (*pSVar6 != P_ON_LOWER);
        pdVar7 = SPxLPBase<double>::lhs
                           ((SPxLPBase<double> *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            in_stack_ffffffffffffff5c);
        dVar1 = *pdVar7;
        pdVar7 = (double *)infinity();
      } while (-*pdVar7 < dVar1);
LAB_0025ecc0:
      pdVar7 = SPxLPBase<double>::lhs
                         ((SPxLPBase<double> *)
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          in_stack_ffffffffffffff5c);
      pdVar8 = SPxLPBase<double>::rhs
                         ((SPxLPBase<double> *)
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          in_stack_ffffffffffffff5c);
      pSVar6 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[](local_18,local_20);
      SPxOut::
      debug<soplex::SPxBasisBase<double>,_const_char_(&)[70],_const_double_&,_const_double_&,_const_soplex::SPxBasisBase<double>::Desc::Status_&,_0>
                (in_RDI,(char (*) [70])
                        "IBASIS22 Nonbasic row with incorrect status: lhs={}, rhs={}, stat={}\n",
                 pdVar7,pdVar8,pSVar6);
      return false;
    }
  }
  SPxOut::debug<soplex::SPxBasisBase<double>,_const_char_(&)[29],_0>
            (in_RDI,(char (*) [29])"IBASIS20 Dimension mismatch\n");
  return false;
  while( true ) {
    pdVar7 = SPxLPBase<double>::lower
                       ((SPxLPBase<double> *)
                        CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff5c);
    dVar1 = *pdVar7;
    pdVar7 = (double *)infinity();
    if (dVar1 <= -*pdVar7) break;
LAB_0025ed67:
    do {
      while( true ) {
        local_24 = local_24 + -1;
        if (local_24 < 0) {
          iVar3 = local_1c;
          iVar4 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x25effe);
          if (iVar3 != iVar4) {
            local_28 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x25f016);
            SPxOut::debug<soplex::SPxBasisBase<double>,_const_char_(&)[45],_int_&,_int,_0>
                      (in_RDI,(char (*) [45])"IBASIS25 Incorrect basis dimension {} != {}\n",
                       &local_1c,&local_28);
            return false;
          }
          return true;
        }
        pSVar6 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                           (local_18 + 1,local_24);
        if (*pSVar6 < ~P_FREE) break;
        pSVar6 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                           (local_18 + 1,local_24);
        SVar2 = *pSVar6;
        SVar5 = dualColStatus(in_stack_ffffffffffffff88,
                              (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
        if (SVar2 != SVar5) {
          pSVar6 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                             (local_18 + 1,local_24);
          SPxOut::
          debug<soplex::SPxBasisBase<double>,_const_char_(&)[56],_int_&,_const_soplex::SPxBasisBase<double>::Desc::Status_&,_0>
                    (in_RDI,(char (*) [56])
                            "IBASIS23 Basic column {} with incorrect dual status {}\n",&local_24,
                     pSVar6);
          return false;
        }
      }
      local_1c = local_1c + 1;
      pSVar6 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                         (local_18 + 1,local_24);
      if (*pSVar6 == P_FIXED) {
        pdVar7 = SPxLPBase<double>::lower
                           ((SPxLPBase<double> *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            in_stack_ffffffffffffff5c);
        in_stack_ffffffffffffff88 = (SPxBasisBase<double> *)*pdVar7;
        pdVar7 = SPxLPBase<double>::upper
                           ((SPxLPBase<double> *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            in_stack_ffffffffffffff5c);
        if (((double)in_stack_ffffffffffffff88 != *pdVar7) ||
           (NAN((double)in_stack_ffffffffffffff88) || NAN(*pdVar7))) goto LAB_0025ef49;
      }
      pSVar6 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                         (local_18 + 1,local_24);
      if (*pSVar6 == P_ON_UPPER) {
        pdVar7 = SPxLPBase<double>::upper
                           ((SPxLPBase<double> *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            in_stack_ffffffffffffff5c);
        in_stack_ffffffffffffff80 = *pdVar7;
        pdVar7 = (double *)infinity();
        if (*pdVar7 <= in_stack_ffffffffffffff80) goto LAB_0025ef49;
      }
      pSVar6 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                         (local_18 + 1,local_24);
    } while (*pSVar6 != P_ON_LOWER);
  }
LAB_0025ef49:
  pdVar7 = SPxLPBase<double>::lower
                     ((SPxLPBase<double> *)
                      CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff5c);
  pdVar8 = SPxLPBase<double>::upper
                     ((SPxLPBase<double> *)
                      CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff5c);
  pSVar6 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[](local_18 + 1,local_24);
  SPxOut::
  debug<soplex::SPxBasisBase<double>,_const_char_(&)[80],_int_&,_const_double_&,_const_double_&,_const_soplex::SPxBasisBase<double>::Desc::Status_&,_0>
            (in_RDI,(char (*) [80])
                    "IBASIS24 Nonbasic column {} with incorrect status: lower={}, upper={}, stat={}\n"
             ,&local_24,pdVar7,pdVar8,pSVar6);
  return false;
}

Assistant:

bool SPxBasisBase<R>::isDescValid(const Desc& ds)
{

   assert(status() > NO_PROBLEM);
   assert(theLP != nullptr);

   int basisdim;

   if(ds.nRows() != theLP->nRows() || ds.nCols() != theLP->nCols())
   {
      SPxOut::debug(this, "IBASIS20 Dimension mismatch\n");
      return false;
   }

   basisdim = 0;

   for(int row = ds.nRows() - 1; row >= 0; --row)
   {
      if(ds.rowstat[row] >= 0)
      {
         if(ds.rowstat[row] != dualRowStatus(row))
         {
            SPxOut::debug(this, "IBASIS21 Basic row {} with incorrect dual status {}\n", row,
                          ds.rowstat[row]);
            return false;
         }
      }
      else
      {
         basisdim++;

         if((ds.rowstat[row] == Desc::P_FIXED
               && theLP->SPxLPBase<R>::lhs(row) != theLP->SPxLPBase<R>::rhs(row))
               || (ds.rowstat[row] == Desc::P_ON_UPPER && theLP->SPxLPBase<R>::rhs(row) >= R(infinity))
               || (ds.rowstat[row] == Desc::P_ON_LOWER && theLP->SPxLPBase<R>::lhs(row) <= R(-infinity)))
         {
            SPxOut::debug(this, "IBASIS22 Nonbasic row with incorrect status: lhs={}, rhs={}, stat={}\n",
                          theLP->SPxLPBase<R>::lhs(row), theLP->SPxLPBase<R>::rhs(row),
                          ds.rowstat[row]);
            return false;
         }
      }
   }

   for(int col = ds.nCols() - 1; col >= 0; --col)
   {
      if(ds.colstat[col] >= 0)
      {
         if(ds.colstat[col] !=  dualColStatus(col))
         {
            SPxOut::debug(this, "IBASIS23 Basic column {} with incorrect dual status {}\n", col,
                          ds.colstat[col]);
            return false;
         }
      }
      else
      {
         basisdim++;

         if((ds.colstat[col] == Desc::P_FIXED
               && theLP->SPxLPBase<R>::lower(col) != theLP->SPxLPBase<R>::upper(col))
               || (ds.colstat[col] == Desc::P_ON_UPPER && theLP->SPxLPBase<R>::upper(col) >= R(infinity))
               || (ds.colstat[col] == Desc::P_ON_LOWER && theLP->SPxLPBase<R>::lower(col) <= R(-infinity)))
         {
            SPxOut::debug(this,
                          "IBASIS24 Nonbasic column {} with incorrect status: lower={}, upper={}, stat={}\n",
                          col, theLP->SPxLPBase<R>::lower(col), theLP->SPxLPBase<R>::upper(col),
                          ds.colstat[col]);
            return false;
         }
      }
   }

   if(basisdim != theLP->nCols())
   {
      SPxOut::debug(this, "IBASIS25 Incorrect basis dimension {} != {}\n", basisdim, theLP->nCols());
      return false;
   }

   // basis descriptor valid
   return true;
}